

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O2

void __thiscall ncnn::Blob::Blob(Blob *this,Blob *param_1)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar2 = param_1->consumer;
  this->producer = param_1->producer;
  this->consumer = iVar2;
  (this->shape).data = (param_1->shape).data;
  piVar1 = (param_1->shape).refcount;
  (this->shape).refcount = piVar1;
  (this->shape).elemsize = (param_1->shape).elemsize;
  (this->shape).elempack = (param_1->shape).elempack;
  (this->shape).allocator = (param_1->shape).allocator;
  iVar2 = (param_1->shape).w;
  iVar3 = (param_1->shape).h;
  iVar4 = (param_1->shape).d;
  (this->shape).dims = (param_1->shape).dims;
  (this->shape).w = iVar2;
  (this->shape).h = iVar3;
  (this->shape).d = iVar4;
  (this->shape).c = (param_1->shape).c;
  (this->shape).cstep = (param_1->shape).cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}